

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float local_c8;
  float fStack_c4;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  float local_88;
  ImVec2 unsaved_marker_pos;
  ImVec2 local_50;
  ImVec2 IStack_48;
  ImVec2 local_40;
  ImVec2 IStack_38;
  
  pIVar5 = GImGui;
  frame_padding_local = frame_padding;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar9 = (bb->Min).x;
  fVar8 = (bb->Max).x;
  if (1.0 < fVar8 - fVar9) {
    fVar1 = (bb->Min).y;
    local_c8 = frame_padding.x;
    fStack_c4 = frame_padding.y;
    fVar9 = fVar9 + local_c8;
    fVar8 = fVar8 - local_c8;
    fVar2 = (bb->Max).y;
    local_88 = label_size.x;
    if ((flags & 1U) != 0) {
      IVar4 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar8 = fVar8 - IVar4.x;
      unsaved_marker_pos.x = (bb->Min).x + local_c8 + local_88 + 2.0;
      if (fVar8 <= unsaved_marker_pos.x) {
        unsaved_marker_pos.x = fVar8;
      }
      unsaved_marker_pos.y = (float)(int)(pIVar5->FontSize * -0.25) + fStack_c4 + (bb->Min).y;
      local_b0.y = (bb->Max).y - fStack_c4;
      local_b0.x = (bb->Max).x - local_c8;
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      RenderTextClippedEx(draw_list,&unsaved_marker_pos,&local_b0,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_a0,(ImRect *)0x0);
    }
    local_b0.y = fVar1 + fStack_c4;
    local_b0.x = fVar9;
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = fVar8 < fVar9 + local_88;
    }
    local_a8.x = fVar8;
    local_a8.y = fVar2;
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         ((bb->Max).x - (bb->Min).x < (pIVar5->Style).TabMinWidthForCloseButton)))) ||
       ((pIVar5->HoveredId != close_button_id && pIVar5->HoveredId != tab_id &&
        (pIVar5->ActiveId != tab_id && pIVar5->ActiveId != close_button_id)))) {
      fVar9 = (bb->Max).x + -1.0;
      bVar6 = false;
    }
    else {
      ImGuiLastItemDataBackup::ImGuiLastItemDataBackup
                ((ImGuiLastItemDataBackup *)&unsaved_marker_pos);
      fVar9 = pIVar5->FontSize;
      PushStyleVar(10,&frame_padding_local);
      local_a0.y = (bb->Min).y;
      local_a0.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar9;
      bVar6 = CloseButton(close_button_id,&local_a0);
      PopStyleVar(1);
      pIVar3 = GImGui->CurrentWindow;
      (pIVar3->DC).LastItemId = (ImGuiID)unsaved_marker_pos.x;
      (pIVar3->DC).LastItemStatusFlags = (ImGuiItemStatusFlags)unsaved_marker_pos.y;
      (pIVar3->DC).LastItemRect.Min = local_50;
      (pIVar3->DC).LastItemRect.Max = IStack_48;
      (pIVar3->DC).LastItemDisplayRect.Min = local_40;
      (pIVar3->DC).LastItemDisplayRect.Max = IStack_38;
      if ((flags & 4U) == 0) {
        bVar7 = IsMouseClicked(2,false);
        if (bVar7) {
          bVar6 = true;
        }
      }
      fVar9 = fVar8 - fVar9;
      fVar8 = fVar9;
    }
    RenderTextEllipsis(draw_list,&local_b0,&local_a8,fVar8,fVar9,label,(char *)0x0,&label_size);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar6;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}